

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ReusesFeaturesFromSibling_Test::
FeaturesTest_ReusesFeaturesFromSibling_Test(FeaturesTest_ReusesFeaturesFromSibling_Test *this)

{
  FeaturesTest_ReusesFeaturesFromSibling_Test *this_local;
  
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FeaturesTest_ReusesFeaturesFromSibling_Test_029ac1a8;
  return;
}

Assistant:

TEST_F(FeaturesTest, ReusesFeaturesFromSibling) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    options { features { field_presence: IMPLICIT } }
    message_type {
      name: "Foo"
      options { deprecated: true }
      field {
        name: "bar1"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_INT64
        options {
          deprecated: true
          features { field_presence: EXPLICIT }
        }
      }
      field {
        name: "baz"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { features { field_presence: EXPLICIT } }
      }
    }
  )pb");
  const Descriptor* message = file->message_type(0);
  EXPECT_NE(&GetFeatures(file), &GetFeatures(message->field(0)));
  EXPECT_EQ(&GetFeatures(message->field(0)), &GetFeatures(message->field(1)));
}